

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::deinit(TessellationShaderTCTEgl_TessLevel *this)

{
  pointer p_Var1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer test_ptr;
  float default_levels [4];
  long lVar4;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x40))(0x8c8e,0);
    (**(code **)(lVar4 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar3 & 0x300) != 0) {
      default_levels[0] = 1.0;
      default_levels[1] = 1.0;
      default_levels[2] = 1.0;
      default_levels[3] = 1.0;
      (**(code **)(lVar4 + 0xfd0))(0x8e73,default_levels);
      (**(code **)(lVar4 + 0xfd0))(0x8e74,default_levels);
    }
    (**(code **)(lVar4 + 0x4e8))(0x8c89);
    (**(code **)(lVar4 + 0xd8))(0);
    if (this->m_bo_id != 0) {
      (**(code **)(lVar4 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    for (test_ptr = (this->m_tests).
                    super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        test_ptr !=
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish; test_ptr = test_ptr + 1) {
      deinitTestDescriptor(this,test_ptr);
    }
    p_Var1 = (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (test_ptr != p_Var1) {
      (this->m_tests).
      super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish = p_Var1;
    }
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Reset GL_PATCH_VERTICES_EXT value to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Revert GL_PATCH_DEFAULT_INNER_LEVEL and GL_PATCH_DEFAULT_OUTER_LEVEL pname
		 * values to the default settings */
		const float default_levels[] = { 1.0f, 1.0f, 1.0f, 1.0f };
		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, default_levels);
		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, default_levels);
	}

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	for (_tests::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		deinitTestDescriptor(&*it);
	}
	m_tests.clear();
}